

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

Matrix3d * Util::OrthoNormMat(Matrix3d *__return_storage_ptr__,Matrix3d *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Scalar *dst_ptr;
  SrcEvaluatorType srcEvaluator;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  undefined1 local_28 [16];
  double local_18;
  
  dVar3 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar4 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  local_38 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[2];
  dVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar6 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar2 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar17 = (local_38 * dVar2 + dVar4 * dVar6 + dVar3 * dVar5) * 0.5;
  auVar11._0_8_ = dVar3 - dVar5 * dVar17;
  auVar11._8_8_ = dVar4 - dVar6 * dVar17;
  auVar9._0_8_ = dVar5 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[6] * dVar17;
  auVar9._8_8_ = dVar6 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] * dVar17;
  local_58 = dVar2 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[8] * dVar17;
  local_38 = local_38 - dVar2 * dVar17;
  local_18 = auVar11._0_8_ * auVar9._8_8_ - auVar9._0_8_ * auVar11._8_8_;
  auVar10._0_8_ = auVar11._8_8_ * local_58 - auVar9._8_8_ * local_38;
  auVar10._8_8_ = auVar9._0_8_ * local_38 - local_58 * auVar11._0_8_;
  auVar14._0_8_ =
       local_38 * local_38 + auVar11._8_8_ * auVar11._8_8_ + auVar11._0_8_ * auVar11._0_8_;
  auVar14._8_8_ = 0;
  auVar15 = sqrtpd(auVar14,auVar14);
  auVar16._0_8_ = auVar15._0_8_;
  local_38 = local_38 / auVar16._0_8_;
  auVar16._8_8_ = auVar16._0_8_;
  local_48 = divpd(auVar11,auVar16);
  auVar12._0_8_ = local_58 * local_58 + auVar9._8_8_ * auVar9._8_8_ + auVar9._0_8_ * auVar9._0_8_;
  auVar12._8_8_ = 0;
  auVar15 = sqrtpd(auVar12,auVar12);
  auVar13._0_8_ = auVar15._0_8_;
  local_58 = local_58 / auVar13._0_8_;
  auVar13._8_8_ = auVar13._0_8_;
  local_68 = divpd(auVar9,auVar13);
  auVar15._0_8_ =
       local_18 * local_18 + auVar10._8_8_ * auVar10._8_8_ + auVar10._0_8_ * auVar10._0_8_;
  auVar15._8_8_ = 0;
  auVar15 = sqrtpd(auVar15,auVar15);
  auVar8._0_8_ = auVar15._0_8_;
  local_18 = local_18 / auVar8._0_8_;
  auVar8._8_8_ = auVar8._0_8_;
  local_28 = divpd(auVar10,auVar8);
  uVar7 = (uint)((ulong)__return_storage_ptr__ >> 3) & 1;
  if (((uint)__return_storage_ptr__ >> 3 & 1) != 0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[0] = (double)local_48._0_8_;
  }
  memcpy((void *)((long)(__return_storage_ptr__->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                        m_data.array + (ulong)(uVar7 * 8)),local_48 + uVar7 * 8,
         (ulong)(uVar7 + 2 + ~uVar7 & 2) * 8 + 0x10);
  if (((ulong)__return_storage_ptr__ >> 3 & 1) == 0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[2] = local_38;
  }
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 3;
  uVar7 = (uint)((ulong)pdVar1 >> 3) & 1;
  if (((uint)pdVar1 >> 3 & 1) != 0) {
    *pdVar1 = (double)local_68._0_8_;
  }
  memcpy((void *)((long)pdVar1 + (ulong)(uVar7 * 8)),local_68 + uVar7 * 8,
         (ulong)(uVar7 + 2 + ~uVar7 & 2) * 8 + 0x10);
  if (((ulong)pdVar1 >> 3 & 1) == 0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[5] = local_58;
  }
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 6;
  uVar7 = (uint)((ulong)pdVar1 >> 3) & 1;
  if (((uint)pdVar1 >> 3 & 1) != 0) {
    *pdVar1 = (double)local_28._0_8_;
  }
  memcpy((void *)((long)pdVar1 + (ulong)(uVar7 * 8)),local_28 + uVar7 * 8,
         (ulong)(uVar7 + 2 + ~uVar7 & 2) * 8 + 0x10);
  if (((ulong)pdVar1 >> 3 & 1) == 0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[8] = local_18;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d OrthoNormMat(Eigen::Matrix3d mat){

		//extract columns
		Eigen::Vector3d x = mat.block(0,0,3,1);
		Eigen::Vector3d y = mat.block(0,1,3,1);
		Eigen::Vector3d z = mat.block(0,2,3,1);

		//error
		double err = x.dot(y);

		//orthogonal vectors
		Eigen::Vector3d x_ort = x - 0.5*err*y;
		Eigen::Vector3d y_ort = y - 0.5*err*z;
		Eigen::Vector3d z_ort = x_ort.cross(y_ort);

		//normalize
		x_ort = x_ort/x_ort.norm();
		y_ort = y_ort/y_ort.norm();
		z_ort = z_ort/z_ort.norm();

		//output
		Eigen::Matrix3d out;
		out.block(0,0,3,1) = x_ort;
		out.block(0,1,3,1) = y_ort;
		out.block(0,2,3,1) = z_ort;

		return out;
		// return mat;


	}